

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMin.hpp
# Opt level: O1

void __thiscall
StackMin<long,_std::less_equal<long>_>::push(StackMin<long,_std::less_equal<long>_> *this,long *e)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  
  plVar1 = (this->stk_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  plVar3 = (this->stk_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_last + -1;
  if ((this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur ==
      (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    if (plVar1 == plVar3) {
      std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                ((deque<long,std::allocator<long>> *)this,e);
    }
    else {
      *plVar1 = *e;
      (this->stk_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur = plVar1 + 1;
    }
    plVar1 = (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (plVar1 == (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) goto LAB_00101872;
    lVar2 = *e;
  }
  else {
    if (plVar1 == plVar3) {
      std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                ((deque<long,std::allocator<long>> *)this,e);
    }
    else {
      *plVar1 = *e;
      (this->stk_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur = plVar1 + 1;
    }
    plVar1 = (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    plVar3 = plVar1;
    if (plVar1 == (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      plVar3 = (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    lVar2 = *e;
    if (plVar3[-1] < lVar2) {
      return;
    }
    if (plVar1 == (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
LAB_00101872:
      std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                ((deque<long,std::allocator<long>> *)&this->min_,e);
      return;
    }
  }
  *plVar1 = lVar2;
  (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = plVar1 + 1;
  return;
}

Assistant:

void push(const Type& e){
    if (min_.empty()){
      stk_.push(e);
      min_.push(e);
    }
    else{
      stk_.push(e);

      if (cmp_(e, min_.top())){
        min_.push(e);
      }
    }
  }